

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O1

value_type * __thiscall
wasm::Random::pick<std::vector<wasm::UnaryOp,std::allocator<wasm::UnaryOp>>>
          (Random *this,vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_> *vec)

{
  pointer pUVar1;
  pointer pUVar2;
  uint32_t uVar3;
  
  pUVar1 = (vec->super__Vector_base<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pUVar2 = (vec->super__Vector_base<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pUVar1 != pUVar2) {
    uVar3 = upTo(this,(uint32_t)((ulong)((long)pUVar2 - (long)pUVar1) >> 2));
    return (vec->super__Vector_base<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>)._M_impl.
           super__Vector_impl_data._M_start + uVar3;
  }
  __assert_fail("!vec.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/random.h"
                ,0x50,
                "const typename T::value_type &wasm::Random::pick(const T &) [T = std::vector<wasm::UnaryOp>]"
               );
}

Assistant:

const typename T::value_type& pick(const T& vec) {
    assert(!vec.empty());
    auto index = upTo(vec.size());
    return vec[index];
  }